

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O0

string * vkt::shaderexecutor::(anonymous_namespace)::generatePassthroughTessControlShader_abi_cxx11_
                   (void)

{
  ostream *poVar1;
  string *in_RDI;
  int local_19c;
  int local_198;
  int ndx_1;
  int ndx;
  ostringstream local_188 [8];
  ostringstream src;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,
                  "#version 310 es\n#extension GL_EXT_tessellation_shader : require\n\n");
  std::operator<<((ostream *)local_188,"layout(vertices = 1) out;\n\n");
  std::operator<<((ostream *)local_188,"void main (void)\n{\n");
  for (local_198 = 0; local_198 < 2; local_198 = local_198 + 1) {
    poVar1 = std::operator<<((ostream *)local_188,"\tgl_TessLevelInner[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_198);
    std::operator<<(poVar1,"] = 1.0;\n");
  }
  for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
    poVar1 = std::operator<<((ostream *)local_188,"\tgl_TessLevelOuter[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_19c);
    std::operator<<(poVar1,"] = 1.0;\n");
  }
  std::operator<<((ostream *)local_188,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

static std::string generatePassthroughTessControlShader (void)
{
	std::ostringstream src;

	src <<  "#version 310 es\n"
			"#extension GL_EXT_tessellation_shader : require\n\n";

	src << "layout(vertices = 1) out;\n\n";

	src << "void main (void)\n{\n";

	for (int ndx = 0; ndx < 2; ndx++)
		src << "\tgl_TessLevelInner[" << ndx << "] = 1.0;\n";

	for (int ndx = 0; ndx < 4; ndx++)
		src << "\tgl_TessLevelOuter[" << ndx << "] = 1.0;\n";

	src << "}\n";

	return src.str();
}